

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O2

float rsg::UnaryExponentialFunc<rsg::InvSqrtOp>::getCompWeight(float outMin,float outMax)

{
  bool bVar1;
  float fVar2;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar4;
  undefined1 extraout_var [12];
  undefined1 auVar3 [16];
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar5;
  float inMax;
  float inMin;
  float local_20;
  float local_1c;
  float local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  fVar5 = 1.0;
  if ((-INFINITY < outMin) && (outMax < INFINITY)) {
    bVar1 = InvSqrtOp::transformValueRange(outMin,outMax,&local_1c,&local_20);
    fVar5 = 0.0;
    if (bVar1) {
      bVar1 = quantizeFloatRange(&local_1c,&local_20);
      fVar5 = 0.0;
      if (bVar1) {
        if ((outMin != outMax) || (NAN(outMin) || NAN(outMax))) {
          if (local_20 < 0.0) {
            local_18 = sqrtf(local_20);
            uStack_14 = extraout_var._0_4_;
            in_XMM1_Dc = extraout_var._4_4_;
            in_XMM1_Dd = extraout_var._8_4_;
          }
          else {
            local_18 = SQRT(local_20);
            uStack_14 = in_XMM1_Db;
          }
          if (local_1c < 0.0) {
            uStack_10 = in_XMM1_Dc;
            uStack_c = in_XMM1_Dd;
            local_1c = sqrtf(local_1c);
            uVar4 = extraout_XMM0_Db;
          }
          else {
            local_1c = SQRT(local_1c);
            uVar4 = 0;
          }
          auVar3._4_4_ = local_1c;
          auVar3._0_4_ = local_18;
          auVar3._8_4_ = uStack_14;
          auVar3._12_4_ = uVar4;
          auVar3 = divps(_DAT_001707f0,auVar3);
          fVar2 = (auVar3._0_4_ - auVar3._4_4_) / (outMax - outMin);
          fVar5 = 0.1;
          if (0.1 <= fVar2) {
            fVar5 = fVar2;
          }
        }
        else {
          fVar5 = 1.0;
        }
      }
    }
  }
  return fVar5;
}

Assistant:

static inline float getCompWeight (float outMin, float outMax)
	{
		if (Scalar::min<float>() == outMin || Scalar::max<float>() == outMax)
			return 1.0f; // Infinite value range, anything goes

		// Transform range
		float inMin, inMax;
		if (!C::transformValueRange(outMin, outMax, inMin, inMax))
			return 0.0f; // Not possible to transform value range (out of range perhaps)

		// Quantize
		if (!quantizeFloatRange(inMin, inMax))
			return 0.0f; // Not possible to quantize - would cause accuracy issues

		if (outMin == outMax)
			return 1.0f; // Constant value and passed quantization

		// Evaluate new intersection
		float intersectionLen	= C::evaluateComp(inMax) - C::evaluateComp(inMin);
		float valRangeLen		= outMax - outMin;

		return deFloatMax(0.1f, intersectionLen/valRangeLen);
	}